

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::setPlaceholderText(QPlainTextEdit *this,QString *placeholderText)

{
  QPlainTextEditPrivate *this_00;
  long lVar1;
  char cVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->placeholderText).d.size;
  if (lVar1 == (placeholderText->d).size) {
    QVar3.m_data = (this_00->placeholderText).d.ptr;
    QVar3.m_size = lVar1;
    QVar4.m_data = (placeholderText->d).ptr;
    QVar4.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar3,QVar4);
    if (cVar2 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->placeholderText,(QString *)placeholderText);
  QPlainTextEditPrivate::updatePlaceholderVisibility(this_00);
  return;
}

Assistant:

void QPlainTextEdit::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QPlainTextEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        d->updatePlaceholderVisibility();
    }
}